

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

void nng_ctx_send(nng_ctx cid,nng_aio *aio)

{
  nni_msg *pnVar1;
  nni_ctx *local_28;
  nni_ctx *ctx;
  nng_aio *pnStack_18;
  int rv;
  nng_aio *aio_local;
  nng_ctx cid_local;
  
  pnStack_18 = aio;
  aio_local._4_4_ = cid.id;
  nni_aio_reset(aio);
  pnVar1 = nni_aio_get_msg(pnStack_18);
  if (pnVar1 == (nni_msg *)0x0) {
    nni_aio_finish_error(pnStack_18,NNG_EINVAL);
  }
  else {
    ctx._4_4_ = nni_ctx_find(&local_28,aio_local._4_4_);
    if (ctx._4_4_ == NNG_OK) {
      nni_ctx_send(local_28,pnStack_18);
      nni_ctx_rele(local_28);
    }
    else {
      nni_aio_finish_error(pnStack_18,ctx._4_4_);
    }
  }
  return;
}

Assistant:

void
nng_ctx_send(nng_ctx cid, nng_aio *aio)
{
	int      rv;
	nni_ctx *ctx;

	nni_aio_reset(aio);
	if (nni_aio_get_msg(aio) == NULL) {
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}
	if ((rv = nni_ctx_find(&ctx, cid.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_ctx_send(ctx, aio);
	nni_ctx_rele(ctx);
}